

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O2

TSpirvInstruction * __thiscall
glslang::TParseContext::makeSpirvInstruction
          (TParseContext *this,TSourceLoc *loc,TString *name,TString *value)

{
  bool bVar1;
  TSpirvInstruction *this_00;
  
  this_00 = (TSpirvInstruction *)
            TSpirvInstruction::operator_new((TSpirvInstruction *)0x30,(size_t)loc);
  TSpirvInstruction::TSpirvInstruction(this_00);
  bVar1 = std::operator==(name,"set");
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)this_00,
              value);
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unknown SPIR-V instruction qualifier",(name->_M_dataplus)._M_p,"");
  }
  return this_00;
}

Assistant:

TSpirvInstruction* TParseContext::makeSpirvInstruction(const TSourceLoc& loc, const TString& name, const TString& value)
{
    TSpirvInstruction* spirvInst = new TSpirvInstruction;
    if (name == "set")
        spirvInst->set = value;
    else
        error(loc, "unknown SPIR-V instruction qualifier", name.c_str(), "");

    return spirvInst;
}